

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.c
# Opt level: O2

void mbedtls_debug_print_buf
               (mbedtls_ssl_context *ssl,int level,char *file,int line,char *text,uchar *buf,
               size_t len)

{
  undefined8 uVar1;
  char cVar2;
  int iVar3;
  long lVar4;
  byte bVar5;
  ulong uVar6;
  ulong uVar7;
  char local_278 [8];
  char str [512];
  char acStack_68 [8];
  char txt [17];
  
  if ((((ssl != (mbedtls_ssl_context *)0x0) && (ssl->conf != (mbedtls_ssl_config *)0x0)) &&
      (ssl->conf->f_dbg != (_func_void_void_ptr_int_char_ptr_int_char_ptr *)0x0)) &&
     (level <= debug_threshold)) {
    str._504_8_ = buf;
    snprintf(local_278,0x200,"dumping \'%s\' (%u bytes)\n",text,len & 0xffffffff);
    (*ssl->conf->f_dbg)(ssl->conf->p_dbg,level,file,line,local_278);
    acStack_68[0] = '\0';
    acStack_68[1] = '\0';
    acStack_68[2] = '\0';
    acStack_68[3] = '\0';
    acStack_68[4] = '\0';
    acStack_68[5] = '\0';
    acStack_68[6] = '\0';
    acStack_68[7] = '\0';
    txt[0] = '\0';
    txt[1] = '\0';
    txt[2] = '\0';
    txt[3] = '\0';
    txt[4] = '\0';
    txt[5] = '\0';
    txt[6] = '\0';
    txt[7] = '\0';
    txt[8] = '\0';
    uVar7 = 0x1000;
    if (len < 0x1000) {
      uVar7 = len;
    }
    bVar5 = -(char)uVar7;
    lVar4 = 0;
    for (uVar6 = 0; uVar7 != uVar6; uVar6 = uVar6 + 1) {
      if ((uVar6 & 0xf) == 0) {
        if (uVar6 != 0) {
          snprintf(local_278 + lVar4,0x200 - lVar4,"  %s\n",acStack_68);
          (*ssl->conf->f_dbg)(ssl->conf->p_dbg,level,file,line,local_278);
          acStack_68[0] = '\0';
          acStack_68[1] = '\0';
          acStack_68[2] = '\0';
          acStack_68[3] = '\0';
          acStack_68[4] = '\0';
          acStack_68[5] = '\0';
          acStack_68[6] = '\0';
          acStack_68[7] = '\0';
          txt[0] = '\0';
          txt[1] = '\0';
          txt[2] = '\0';
          txt[3] = '\0';
          txt[4] = '\0';
          txt[5] = '\0';
          txt[6] = '\0';
          txt[7] = '\0';
          txt[8] = '\0';
          lVar4 = 0;
        }
        iVar3 = snprintf(local_278 + lVar4,0x200 - lVar4,"%04x: ",uVar6 & 0xffffffff);
        lVar4 = lVar4 + iVar3;
      }
      uVar1 = str._504_8_;
      iVar3 = snprintf(local_278 + lVar4,0x200 - lVar4," %02x",(ulong)*(byte *)(str._504_8_ + uVar6)
                      );
      lVar4 = lVar4 + iVar3;
      cVar2 = *(char *)(uVar1 + uVar6);
      if (0x5e < (byte)(cVar2 - 0x20U)) {
        cVar2 = '.';
      }
      txt[(uVar6 & 0xf) - 8] = cVar2;
      bVar5 = bVar5 + 1;
    }
    if (len != 0) {
      while( true ) {
        if ((bVar5 & 0xf) == ((byte)uVar7 & 0xf)) break;
        iVar3 = snprintf(local_278 + lVar4,0x200U - lVar4,"   ");
        lVar4 = lVar4 + iVar3;
        uVar7 = uVar7 + 1;
      }
      snprintf(local_278 + lVar4,0x200U - lVar4,"  %s\n",acStack_68);
      (*ssl->conf->f_dbg)(ssl->conf->p_dbg,level,file,line,local_278);
    }
  }
  return;
}

Assistant:

void mbedtls_debug_print_buf(const mbedtls_ssl_context *ssl, int level,
                             const char *file, int line, const char *text,
                             const unsigned char *buf, size_t len)
{
    char str[DEBUG_BUF_SIZE];
    char txt[17];
    size_t i, idx = 0;

    if (NULL == ssl              ||
        NULL == ssl->conf        ||
        NULL == ssl->conf->f_dbg ||
        level > debug_threshold) {
        return;
    }

    mbedtls_snprintf(str + idx, sizeof(str) - idx, "dumping '%s' (%u bytes)\n",
                     text, (unsigned int) len);

    debug_send_line(ssl, level, file, line, str);

    memset(txt, 0, sizeof(txt));
    for (i = 0; i < len; i++) {
        if (i >= 4096) {
            break;
        }

        if (i % 16 == 0) {
            if (i > 0) {
                mbedtls_snprintf(str + idx, sizeof(str) - idx, "  %s\n", txt);
                debug_send_line(ssl, level, file, line, str);

                idx = 0;
                memset(txt, 0, sizeof(txt));
            }

            idx += mbedtls_snprintf(str + idx, sizeof(str) - idx, "%04x: ",
                                    (unsigned int) i);

        }

        idx += mbedtls_snprintf(str + idx, sizeof(str) - idx, " %02x",
                                (unsigned int) buf[i]);
        txt[i % 16] = (buf[i] > 31 && buf[i] < 127) ? buf[i] : '.';
    }

    if (len > 0) {
        for (/* i = i */; i % 16 != 0; i++) {
            idx += mbedtls_snprintf(str + idx, sizeof(str) - idx, "   ");
        }

        mbedtls_snprintf(str + idx, sizeof(str) - idx, "  %s\n", txt);
        debug_send_line(ssl, level, file, line, str);
    }
}